

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  unsigned_short uVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  long in_RDX;
  uint32_t i_1;
  size_t sVar8;
  ulong size;
  uint16_vec sym_freq;
  
  uVar5 = 0;
  if (0xffffbfff < (int)ctx - 0x4001U) {
    size = (ulong)ctx & 0xffffffff;
    vector<unsigned_short>::vector(&sym_freq,size);
    for (uVar6 = 0; size != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = *(uint *)(in_RDX + uVar6 * 4);
      if (uVar5 <= uVar1) {
        uVar5 = uVar1;
      }
    }
    if (uVar5 < 0xffff) {
      for (sVar8 = 0; size != sVar8; sVar8 = sVar8 + 1) {
        uVar4 = *(unsigned_short *)(in_RDX + sVar8 * 4);
        puVar7 = vector<unsigned_short>::operator[](&sym_freq,sVar8);
        *puVar7 = uVar4;
      }
    }
    else {
      for (sVar8 = 0; size != sVar8; sVar8 = sVar8 + 1) {
        uVar6 = (ulong)*(uint *)(in_RDX + sVar8 * 4);
        if (uVar6 != 0) {
          uVar6 = uVar6 * 0xfffe + (ulong)(uVar5 >> 1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = CONCAT44(0,uVar5);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar6;
          uVar4 = SUB162(auVar3 / auVar2,0);
          if (0xfffd < SUB164(auVar3 / auVar2,0)) {
            uVar4 = 0xfffe;
          }
          if (uVar6 < CONCAT44(0,uVar5)) {
            uVar4 = 1;
          }
          puVar7 = vector<unsigned_short>::operator[](&sym_freq,sVar8);
          *puVar7 = uVar4;
        }
      }
    }
    vector<unsigned_short>::operator[](&sym_freq,0);
    uVar5 = init(this,ctx);
    free(sym_freq.m_p);
  }
  return uVar5;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint32_t *pSym_freq, uint32_t max_code_size)
	{
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint16_vec sym_freq(num_syms);

		uint32_t max_freq = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			max_freq = maximum(max_freq, pSym_freq[i]);

		if (max_freq < UINT16_MAX)
		{
			for (uint32_t i = 0; i < num_syms; i++)
				sym_freq[i] = static_cast<uint16_t>(pSym_freq[i]);
		}
		else
		{
			for (uint32_t i = 0; i < num_syms; i++)
			{
				if (pSym_freq[i])
				{
					uint32_t f = static_cast<uint32_t>((static_cast<uint64_t>(pSym_freq[i]) * 65534U + (max_freq >> 1)) / max_freq);
					sym_freq[i] = static_cast<uint16_t>(clamp<uint32_t>(f, 1, 65534));
				}
			}
		}

		return init(num_syms, &sym_freq[0], max_code_size);
	}